

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O3

bool __thiscall DataSourceDOS::load(DataSourceDOS *this)

{
  pointer *ppDVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  iterator iVar4;
  uint *puVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  Buffer *__tmp;
  uint uVar11;
  ulong uVar12;
  PBuffer anim;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_70 [3];
  long *local_40 [2];
  long local_30 [2];
  
  iVar10 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[5])();
  if ((char)iVar10 == '\0') {
    bVar9 = false;
  }
  else {
    std::__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<Buffer>,std::__cxx11::string&>
              ((__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2> *)local_d8,
               (allocator<Buffer> *)local_b8,
               &(this->super_DataSourceLegacy).super_DataSourceBase.path);
    local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    uVar7 = local_d8._0_8_;
    local_d8._0_8_ = (_func_int **)0x0;
    local_d8._8_8_ = (element_type *)0x0;
    (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar7;
    p_Var2 = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_88._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      local_88._M_pi =
           (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    local_98._8_8_ = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((element_type *)local_88._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((element_type *)local_88._M_pi)->super_enable_shared_from_this<Buffer>).
                 _M_weak_this.super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((element_type *)local_88._M_pi)->super_enable_shared_from_this<Buffer>).
                      _M_weak_this.super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((element_type *)local_88._M_pi)->super_enable_shared_from_this<Buffer>).
                 _M_weak_this.super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((element_type *)local_88._M_pi)->super_enable_shared_from_this<Buffer>).
                      _M_weak_this.super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
    }
    UnpackerTPWM::UnpackerTPWM((UnpackerTPWM *)local_d8,(PBuffer *)(local_98 + 8));
    if ((element_type *)local_88._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
    }
    UnpackerTPWM::convert((UnpackerTPWM *)local_b8);
    uVar8 = local_b8._8_8_;
    uVar7 = local_b8._0_8_;
    local_b8._0_8_ = (_func_int **)0x0;
    local_b8._8_8_ = (element_type *)0x0;
    p_Var2 = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar7;
    (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
       (element_type *)local_b8._8_8_ != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"data","");
    Log::Logger::operator[]((Logger *)local_b8,(string *)&Log::Verbose);
    Log::Stream::operator<<((Stream *)local_b8,"Data file is compressed");
    Log::Stream::~Stream((Stream *)local_b8);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    local_d8._0_8_ = &PTR__Convertor_001571d0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_);
    }
    peVar3 = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar11 = *(uint *)peVar3->read;
    peVar3->read = (uint8_t *)((long)peVar3->read + 4);
    uVar6 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    if (peVar3->endianess != EndianessBig) {
      uVar6 = uVar11;
    }
    uVar12 = (ulong)uVar6;
    local_d8._0_8_ = (_func_int **)0x0;
    local_d8._8_8_ = (element_type *)0x0;
    iVar4._M_current =
         (this->entries).
         super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->entries).
        super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>::
      _M_realloc_insert<DataSourceDOS::DataEntry>(&this->entries,iVar4,(DataEntry *)local_d8);
    }
    else {
      (iVar4._M_current)->offset = 0;
      (iVar4._M_current)->size = 0;
      ppDVar1 = &(this->entries).
                 super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppDVar1 = *ppDVar1 + 1;
    }
    for (; uVar12 != 0; uVar12 = uVar12 - 1) {
      peVar3 = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar5 = (uint *)peVar3->read;
      local_d8._8_4_ = *puVar5;
      peVar3->read = (uint8_t *)(puVar5 + 1);
      if (peVar3->endianess == EndianessBig) {
        local_d8._8_4_ =
             (uint)local_d8._8_4_ >> 0x18 | (local_d8._8_4_ & 0xff0000) >> 8 |
             (local_d8._8_4_ & 0xff00) << 8 | local_d8._8_4_ << 0x18;
        uVar11 = puVar5[1];
        peVar3->read = (uint8_t *)(puVar5 + 2);
        uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
        ;
      }
      else {
        uVar11 = puVar5[1];
        peVar3->read = (uint8_t *)(puVar5 + 2);
      }
      local_d8._12_4_ = 0;
      local_d8._0_8_ = ZEXT48(uVar11);
      iVar4._M_current =
           (this->entries).
           super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->entries).
          super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<DataSourceDOS::DataEntry,std::allocator<DataSourceDOS::DataEntry>>::
        _M_realloc_insert<DataSourceDOS::DataEntry_const&>
                  ((vector<DataSourceDOS::DataEntry,std::allocator<DataSourceDOS::DataEntry>> *)
                   &this->entries,iVar4,(DataEntry *)local_d8);
      }
      else {
        (iVar4._M_current)->offset = local_d8._0_8_;
        (iVar4._M_current)->size = local_d8._8_8_;
        ppDVar1 = &(this->entries).
                   super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
    }
    fixup(this);
    get_object((DataSourceDOS *)local_d8,(size_t)this);
    *(undefined4 *)(local_d8._0_8_ + 0x48) = 0;
    uVar11 = *(uint *)*(_func_int **)(local_d8._0_8_ + 0x40);
    *(_func_int **)(local_d8._0_8_ + 0x40) = *(_func_int **)(local_d8._0_8_ + 0x40) + 4;
    if (*(_func_int **)(local_d8._0_8_ + 0x20) ==
        (_func_int *)
        (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18)
       ) {
      Buffer::pop_tail((Buffer *)local_b8);
      uVar8 = local_b8._8_8_;
      local_d8._0_8_ = local_b8._0_8_;
      uVar7 = local_d8._8_8_;
      local_b8._0_8_ = (_func_int **)0x0;
      local_b8._8_8_ = (element_type *)0x0;
      local_d8._8_8_ = uVar8;
      if (((element_type *)uVar7 != (element_type *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7),
         (element_type *)local_b8._8_8_ != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      local_b8._24_8_ = local_d8._0_8_;
      if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                   super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                        super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                   super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                        super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_98._0_8_ = local_d8._8_8_;
      bVar9 = DataSourceLegacy::load_animation_table
                        (&this->super_DataSourceLegacy,(PBuffer *)(local_b8 + 0x18));
      if ((element_type *)local_98._0_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_);
      }
    }
    else {
      local_80._M_pi = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"data","");
      Log::Logger::operator[]((Logger *)local_b8,(string *)&Log::Error);
      Log::Stream::operator<<((Stream *)local_b8,"Could not extract animation table.");
      Log::Stream::~Stream((Stream *)local_b8);
      if (local_80._M_pi != local_70) {
        operator_delete(local_80._M_pi,
                        (ulong)((long)(size_t *)local_70[0]._vptr__Sp_counted_base + 1));
      }
      bVar9 = false;
    }
    if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
  }
  return bVar9;
}

Assistant:

bool
DataSourceDOS::load() {
  if (!check()) {
    return false;
  }

  try {
    spae = std::make_shared<Buffer>(path);
  } catch (...) {
    return false;
  }

  // Check that data file is decompressed
  try {
    UnpackerTPWM unpacker(spae);
    spae = unpacker.convert();
    Log::Verbose["data"] << "Data file is compressed";
  }  catch (...) {
    Log::Verbose["data"] << "Data file is not compressed";
  }

  // Read the number of entries in the index table.
  // Some entries are undefined (size and offset are zero).
  size_t entry_count = spae->pop<uint32_t>();
  entries.push_back({0, 0});  // first entry is whole file itself, drop it
  for (size_t i = 0; i < entry_count; i++) {
    DataEntry entry;
    entry.size = spae->pop<uint32_t>();
    entry.offset = spae->pop<uint32_t>();
    entries.push_back(entry);
  }

  fixup();

  // The first uint32 is the byte length of the rest
  // of the table in big endian order.
  PBuffer anim = get_object(DATA_SERF_ANIMATION_TABLE);
  anim->set_endianess(Buffer::EndianessBig);
  size_t size = anim->get_size();
  if (size != anim->pop<uint32_t>()) {
    Log::Error["data"] << "Could not extract animation table.";
    return false;
  }
  anim = anim->pop_tail();

  return load_animation_table(anim);
}